

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

Workitem * __thiscall
LinkedListPool<depspawn::internal::Workitem,true,false>::malloc<depspawn::internal::arg_info*&,int&>
          (LinkedListPool<depspawn::internal::Workitem,_true,_false> *this,arg_info **args,
          int *args_1)

{
  Workitem *pWVar1;
  undefined8 in_RDX;
  LinkedListPool<depspawn::internal::Workitem,_true,_false> *in_RSI;
  Workitem *in_RDI;
  Workitem *ret;
  
  pWVar1 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc(in_RSI);
  depspawn::internal::Workitem::Workitem(in_RDI,(arg_info *)in_RSI,(int)((ulong)in_RDX >> 0x20));
  return pWVar1;
}

Assistant:

T* malloc(Args&&... args)
   {
     T * const ret = this->intl_malloc();
     new (ret) T(std::forward<Args>(args)...);
     return ret;
   }